

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O2

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape::print_to_file
          (Persistence_landscape *this,char *filename)

{
  long lVar1;
  ostream *poVar2;
  pointer pvVar3;
  long lVar4;
  size_t i;
  long lVar5;
  long lVar6;
  ofstream write;
  
  std::ofstream::ofstream(&write);
  std::ofstream::open((char *)&write,(_Ios_Openmode)filename);
  pvVar3 = (this->land).
           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar6 = 0;
      lVar6 != ((long)(this->land).
                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18;
      lVar6 = lVar6 + 1) {
    poVar2 = std::operator<<((ostream *)&write,"#lambda_");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar4 = 0;
    lVar5 = 1;
    while( true ) {
      pvVar3 = (this->land).
               super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar1 = *(long *)&pvVar3[lVar6].
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl;
      if (lVar5 == ((long)*(pointer *)
                           ((long)&pvVar3[lVar6].
                                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                   ._M_impl + 8) - lVar1 >> 4) + -1) break;
      poVar2 = std::ostream::_M_insert<double>(*(double *)(lVar1 + 0x10 + lVar4));
      std::operator<<(poVar2,"  ");
      poVar2 = std::ostream::_M_insert<double>
                         (*(double *)
                           (*(long *)&(this->land).
                                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                      ._M_impl + 0x18 + lVar4));
      std::endl<char,std::char_traits<char>>(poVar2);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x10;
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&write);
  return;
}

Assistant:

void Persistence_landscape::print_to_file(const char* filename) const {
  std::ofstream write;
  write.open(filename);
  for (size_t dim = 0; dim != this->land.size(); ++dim) {
    write << "#lambda_" << dim << std::endl;
    for (size_t i = 1; i != this->land[dim].size() - 1; ++i) {
      write << this->land[dim][i].first << "  " << this->land[dim][i].second << std::endl;
    }
  }
  write.close();
}